

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabel::setSelection(QLabel *this,int start,int length)

{
  long lVar1;
  QLabelPrivate *this_00;
  int iVar2;
  long in_FS_OFFSET;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if (this_00->control != (QWidgetTextControl *)0x0) {
    QLabelPrivate::ensureTextPopulated(this_00);
    _cursor = &DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::textCursor((QWidgetTextControl *)&cursor);
    iVar2 = (int)(QWidgetTextControl *)&cursor;
    QTextCursor::setPosition(iVar2,start);
    QTextCursor::setPosition(iVar2,length + start);
    QWidgetTextControl::setTextCursor((QWidgetTextControl *)this_00->control,&cursor,false);
    QTextCursor::~QTextCursor(&cursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setSelection(int start, int length)
{
    Q_D(QLabel);
    if (d->control) {
        d->ensureTextPopulated();
        QTextCursor cursor = d->control->textCursor();
        cursor.setPosition(start);
        cursor.setPosition(start + length, QTextCursor::KeepAnchor);
        d->control->setTextCursor(cursor);
    }
}